

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O1

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::async_write
          (connection<websocketpp::config::asio::transport_config> *this,
          vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
          *bufs,write_handler *handler)

{
  pointer *ppcVar1;
  iterator __position;
  element_type *peVar2;
  element_type *peVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aVar4;
  pointer pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aVar6;
  undefined1 local_168 [40];
  element_type *local_140;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Manager_type local_120;
  _Invoker_type local_118;
  element_type *local_110;
  element_type *peStack_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  element_type *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  _Any_data local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [16];
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  local_a8;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  _Any_data local_68;
  _Manager_type local_58;
  undefined8 local_40;
  
  pbVar5 = (bufs->
           super__Vector_base<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar5 != (bufs->
                super__Vector_base<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_168._16_8_ = pbVar5->buf;
      local_168._24_8_ = pbVar5->len;
      __position._M_current =
           (this->m_bufs).
           super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_bufs).super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
        _M_realloc_insert<asio::const_buffer>
                  (&this->m_bufs,__position,(const_buffer *)(local_168 + 0x10));
      }
      else {
        (__position._M_current)->data_ = (void *)local_168._16_8_;
        (__position._M_current)->size_ = local_168._24_8_;
        ppcVar1 = &(this->m_bufs).
                   super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != (bufs->
                       super__Vector_base<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  peVar2 = (this->super_socket_con_type).m_socket.
           super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar3 = (this->m_strand).super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  get_shared((connection<websocketpp::config::asio::transport_config> *)local_168);
  local_b8 = (element_type *)handle_async_write;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::function<void_(const_std::error_code_&)>::function
            ((function<void_(const_std::error_code_&)> *)&local_a8,handler);
  local_a8.
  super__Head_base<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_false>
  ._M_head_impl.
  super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_168._0_8_;
  local_a8.
  super__Head_base<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_false>
  ._M_head_impl.
  super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
  local_168._0_16_ = ZEXT816(0) << 0x20;
  local_78 = local_b8;
  p_Stack_70 = p_Stack_b0;
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)&local_68,&local_a8);
  local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->m_write_handler_allocator
  ;
  local_f8 = local_78;
  _Stack_f0._M_pi = p_Stack_70;
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)&local_e8,
                (_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)&local_68);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
  }
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  local_168._16_8_ = peVar3->service_;
  local_168._24_8_ = peVar3->impl_;
  local_168._32_8_ = local_100._M_pi;
  local_140 = local_f8;
  _Stack_138._M_pi = _Stack_f0._M_pi;
  aVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           )(ZEXT816(0) << 0x20);
  local_120 = (_Manager_type)0x0;
  local_118 = (_Invoker_type)local_d8._8_8_;
  local_130 = aVar6;
  aVar4 = local_d8;
  if ((_Manager_type)local_d8._M_allocated_capacity != (_Manager_type)0x0) {
    local_130._8_8_ = local_e8._8_8_;
    local_130._M_allocated_capacity = local_e8._M_unused._0_8_;
    local_120 = (_Manager_type)local_d8._M_allocated_capacity;
    aVar4 = aVar6;
  }
  local_d8 = aVar4;
  local_110 = (element_type *)local_c8._0_8_;
  peStack_108 = (element_type *)local_c8._8_8_;
  local_78 = (element_type *)
             (this->m_bufs).
             super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_c8 = (undefined1  [16])aVar6;
  ::asio::detail::
  start_write_buffer_sequence_op<asio::basic_stream_socket<asio::ip::tcp>,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>,__gnu_cxx::__normal_iterator<asio::const_buffer_const*,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>>,asio::detail::transfer_all_t,asio::detail::wrapped_handler<asio::io_context::strand,websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>>,asio::detail::is_continuation_if_running>>
            (peVar2,&this->m_bufs);
  if (peStack_108 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_108);
  }
  if (local_120 != (_Manager_type)0x0) {
    (*local_120)((_Any_data *)&local_130,(_Any_data *)&local_130,__destroy_functor);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  if ((_func_void *)local_d8._M_allocated_capacity != (_func_void *)0x0) {
    (*(code *)local_d8._M_allocated_capacity)(&local_e8,&local_e8,3);
  }
  if (local_a8.
      super__Head_base<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_false>
      ._M_head_impl.
      super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.
               super__Head_base<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_false>
               ._M_head_impl.
               super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_a8.
      super__Tuple_impl<1UL,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<1UL,_std::function<void_(const_std::error_code_&)>,_false>._M_head_impl.
      super__Function_base._M_manager != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*local_a8.
      super__Tuple_impl<1UL,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<1UL,_std::function<void_(const_std::error_code_&)>,_false>._M_head_impl.
      super__Function_base._M_manager)(&local_a8,&local_a8,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  return;
}

Assistant:

void async_write(std::vector<buffer> const & bufs, write_handler handler) {
        std::vector<buffer>::const_iterator it;

        for (it = bufs.begin(); it != bufs.end(); ++it) {
            m_bufs.push_back(lib::asio::buffer((*it).buf,(*it).len));
        }

        if (config::enable_multithreading) {
            lib::asio::async_write(
                socket_con_type::get_socket(),
                m_bufs,
                m_strand->wrap(make_custom_alloc_handler(
                    m_write_handler_allocator,
                    lib::bind(
                        &type::handle_async_write, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                ))
            );
        } else {
            lib::asio::async_write(
                socket_con_type::get_socket(),
                m_bufs,
                make_custom_alloc_handler(
                    m_write_handler_allocator,
                    lib::bind(
                        &type::handle_async_write, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                )
            );
        }
    }